

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.cc
# Opt level: O2

void __thiscall kratos::FSM::add_child_fsm(FSM *this,FSM *fsm)

{
  UserException *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  basic_string_view<char> bVar1;
  string_view format_str;
  format_args args;
  string local_68;
  __shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2> local_48;
  pointer local_38;
  size_type sStack_30;
  FSM *local_28;
  FSM *fsm_local;
  
  local_28 = fsm;
  if (fsm->generator_ == this->generator_) {
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,kratos::FSM*>,std::_Select1st<std::pair<std::__cxx11::string_const,kratos::FSM*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,kratos::FSM*>>>
    ::_M_emplace_unique<std::__cxx11::string&,kratos::FSM*&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,kratos::FSM*>,std::_Select1st<std::pair<std::__cxx11::string_const,kratos::FSM*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,kratos::FSM*>>>
                *)&this->child_fsms_,&fsm->fsm_name_,&local_28);
    local_28->parent_fsm_ = this;
    local_48._M_ptr = (element_type *)0x0;
    local_48._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(local_28->start_state_).
                super___shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>,&local_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
    return;
  }
  this_00 = (UserException *)__cxa_allocate_exception(0x10);
  local_48._M_ptr = (element_type *)(fsm->fsm_name_)._M_dataplus._M_p;
  local_48._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(fsm->fsm_name_)._M_string_length;
  local_38 = (this->fsm_name_)._M_dataplus._M_p;
  sStack_30 = (this->fsm_name_)._M_string_length;
  bVar1 = fmt::v7::to_string_view<char,_0>("FSM {0} doesn\'t have the same generator parent as {1}")
  ;
  format_str.data_ = (char *)bVar1.size_;
  format_str.size_ = 0xdd;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_48;
  fmt::v7::detail::vformat_abi_cxx11_(&local_68,(detail *)bVar1.data_,format_str,args);
  UserException::UserException(this_00,&local_68);
  __cxa_throw(this_00,&UserException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void FSM::add_child_fsm(FSM* fsm) {
    if (fsm->generator_ != generator_)
        throw UserException(::format("FSM {0} doesn't have the same generator parent as {1}",
                                     fsm->fsm_name_, fsm_name_));
    child_fsms_.emplace(fsm->fsm_name_, fsm);
    fsm->parent_fsm_ = this;
    // erase the start from the child generator
    fsm->start_state_ = nullptr;
}